

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::IsActiveScriptPubKeyMan(CWallet *this,ScriptPubKeyMan *spkm)

{
  long lVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  bool bVar3;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar3 = (_Rb_tree_header *)p_Var2 ==
            &(this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header;
    if (bVar3) {
LAB_00542d03:
      for (p_Var2 = (this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (bVar4 = (_Rb_tree_header *)p_Var2 !=
                   &(this->m_internal_spk_managers)._M_t._M_impl.super__Rb_tree_header, bVar4 &&
          ((ScriptPubKeyMan *)p_Var2[1]._M_parent != spkm));
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
      }
LAB_00542d2c:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return bVar4;
      }
      __stack_chk_fail();
    }
    if ((ScriptPubKeyMan *)p_Var2[1]._M_parent == spkm) {
      bVar4 = true;
      if (!bVar3) goto LAB_00542d2c;
      goto LAB_00542d03;
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
  } while( true );
}

Assistant:

bool CWallet::IsActiveScriptPubKeyMan(const ScriptPubKeyMan& spkm) const
{
    for (const auto& [_, ext_spkm] : m_external_spk_managers) {
        if (ext_spkm == &spkm) return true;
    }
    for (const auto& [_, int_spkm] : m_internal_spk_managers) {
        if (int_spkm == &spkm) return true;
    }
    return false;
}